

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O1

_Bool mfb_set_viewport(mfb_window *window,uint offset_x,uint offset_y,uint width,uint height)

{
  SWindowData *window_data;
  
  if ((width + offset_x <= *(uint32_t *)(window + 0x50)) &&
     (height + offset_y <= *(uint *)(window + 0x54))) {
    *(uint *)(window + 0x58) = offset_x;
    *(uint *)(window + 0x5c) = offset_y;
    *(uint *)(window + 0x60) = width;
    *(uint *)(window + 100) = height;
    calc_dst_factor((SWindowData *)window,*(uint32_t *)(window + 0x50),*(uint *)(window + 0x54));
    return true;
  }
  return false;
}

Assistant:

bool
mfb_set_viewport(struct mfb_window *window, unsigned offset_x, unsigned offset_y, unsigned width, unsigned height)  {
    SWindowData *window_data = (SWindowData *) window;

    if (offset_x + width > window_data->window_width) {
        return false;
    }
    if (offset_y + height > window_data->window_height) {
        return false;
    }

    window_data->dst_offset_x = offset_x;
    window_data->dst_offset_y = offset_y;
    window_data->dst_width    = width;
    window_data->dst_height   = height;
    calc_dst_factor(window_data, window_data->window_width, window_data->window_height);

    return true;
}